

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O2

void __thiscall
JsrtDebugManager::GetBreakpoints
          (JsrtDebugManager *this,JavascriptArray **bpsArray,ScriptContext *scriptContext)

{
  ScriptContext *scriptContext_00;
  ProbeList *pPVar1;
  Probe *pPVar2;
  JavascriptArray *instance;
  DebugContext *pDVar3;
  DynamicObject *object;
  Var value;
  Var index;
  int i;
  long lVar4;
  
  scriptContext_00 =
       ((((((*bpsArray)->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
         javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  pDVar3 = Js::ScriptContext::GetDebugContext(scriptContext);
  pPVar1 = pDVar3->diagProbesContainer->diagProbeList;
  for (lVar4 = 0;
      lVar4 < (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
              count; lVar4 = lVar4 + 1) {
    pPVar2 = (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
             buffer[lVar4];
    object = Js::JavascriptLibrary::CreateObject
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
    JsrtDebugUtils::AddPropertyToObject
              (object,(JsrtDebugPropertyId)0x1,
               *(uint32 *)&pPVar2[4].super_HaltCallback._vptr_HaltCallback,scriptContext);
    JsrtDebugUtils::AddLineColumnToObject
              (object,(FunctionBody *)pPVar2[3].super_HaltCallback._vptr_HaltCallback,
               *(int *)((long)&pPVar2[1].super_HaltCallback._vptr_HaltCallback + 4));
    JsrtDebugUtils::AddScriptIdToObject
              (object,(Utf8SourceInfo *)pPVar2[2].super_HaltCallback._vptr_HaltCallback[1]);
    value = Js::CrossSite::MarshalVar(scriptContext_00,object,false);
    instance = *bpsArray;
    index = Js::JavascriptNumber::ToVar((instance->super_ArrayObject).length,scriptContext_00);
    Js::JavascriptOperators::OP_SetElementI
              (instance,index,value,scriptContext_00,PropertyOperation_None);
  }
  return;
}

Assistant:

void JsrtDebugManager::GetBreakpoints(Js::JavascriptArray** bpsArray, Js::ScriptContext* scriptContext)
{
    Js::ScriptContext* arrayScriptContext = (*bpsArray)->GetScriptContext();
    Js::ProbeContainer* probeContainer = scriptContext->GetDebugContext()->GetProbeContainer();

    probeContainer->MapProbes([&](int i, Js::Probe* pProbe)
    {
        Js::BreakpointProbe* bp = (Js::BreakpointProbe*)pProbe;
        Js::DynamicObject* bpObject = scriptContext->GetLibrary()->CreateObject();

        JsrtDebugUtils::AddPropertyToObject(bpObject, JsrtDebugPropertyId::breakpointId, bp->GetId(), scriptContext);
        JsrtDebugUtils::AddLineColumnToObject(bpObject, bp->GetFunctionBody(), bp->GetBytecodeOffset());

        Js::Utf8SourceInfo* utf8SourceInfo = bp->GetDbugDocument()->GetUtf8SourceInfo();
        JsrtDebugUtils::AddScriptIdToObject(bpObject, utf8SourceInfo);

        Js::Var marshaledObj = Js::CrossSite::MarshalVar(arrayScriptContext, bpObject);
        Js::JavascriptOperators::OP_SetElementI((Js::Var)(*bpsArray), Js::JavascriptNumber::ToVar((*bpsArray)->GetLength(), arrayScriptContext), marshaledObj, arrayScriptContext);
    });
}